

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsaStreamComponent_RegisterChannels
                  (PaAlsaStreamComponent *self,PaUtilBufferProcessor *bp,unsigned_long *numFrames,
                  int *xrun)

{
  PaUtilConverter *pPVar1;
  undefined8 uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  code *pcVar6;
  pthread_t __thread1;
  char *errorText;
  void *pvVar7;
  ssize_t sVar8;
  snd_pcm_sframes_t sVar9;
  ulong uVar10;
  unsigned_long uVar11;
  undefined8 uStack_d0;
  unsigned_long local_c8;
  uchar *local_c0;
  long local_b8;
  long local_b0;
  int local_a4;
  unsigned_long uStack_a0;
  int i_1;
  uchar *buffer_1;
  ulong uStack_90;
  uint buf_per_ch_size_1;
  unsigned_long __vla_expr0;
  int local_7c;
  uint local_78;
  int res;
  uint buf_per_ch_size;
  int swidth;
  uint bufferSize;
  int __pa_unsure_error_id;
  unsigned_long framesAvail;
  uchar *puStack_58;
  int i;
  uchar *p;
  uchar *buffer;
  _func_void_PaUtilBufferProcessor_ptr_uint_void_ptr_uint *setChannel;
  snd_pcm_channel_area_t *area;
  snd_pcm_channel_area_t *areas;
  int *piStack_28;
  PaError result;
  int *xrun_local;
  unsigned_long *numFrames_local;
  PaUtilBufferProcessor *bp_local;
  PaAlsaStreamComponent *self_local;
  
  areas._4_4_ = 0;
  pcVar6 = PaUtil_SetOutputChannel;
  if (self->streamDir == StreamDirection_In) {
    pcVar6 = PaUtil_SetInputChannel;
  }
  uStack_d0 = 0x11c5e4;
  buffer = (uchar *)pcVar6;
  piStack_28 = xrun;
  xrun_local = (int *)numFrames;
  numFrames_local = &bp->framesPerUserBuffer;
  bp_local = (PaUtilBufferProcessor *)self;
  paUtilErr_ = PaAlsaStreamComponent_GetAvailableFrames(self,(unsigned_long *)&bufferSize,xrun);
  if (paUtilErr_ < 0) {
    uStack_d0 = 0x11c60b;
    PaUtil_DebugPrint(
                     "Expression \'PaAlsaStreamComponent_GetAvailableFrames( self, &framesAvail, xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4077\n"
                     );
    areas._4_4_ = paUtilErr_;
  }
  else if (*piStack_28 == 0) {
    if (bp_local->userOutputSampleFormatIsEqualToHost == 0) {
      local_b8 = (long)*(int *)((long)&bp_local->framesPerHostBuffer + 4);
      uStack_d0 = 0x11c715;
      sVar8 = (*alsa_snd_pcm_format_size)(bp_local->bytesPerUserOutputSample,*(size_t *)xrun_local);
      buf_per_ch_size = (int)local_b8 * (int)sVar8;
      if (bp_local->inputChannelCount < buf_per_ch_size) {
        bp_local->inputChannelCount = buf_per_ch_size;
        uStack_d0 = 0x11c74d;
        pvVar7 = realloc((void *)bp_local->framesPerTempBuffer,(ulong)buf_per_ch_size);
        bp_local->framesPerTempBuffer = (unsigned_long)pvVar7;
        if (bp_local->framesPerTempBuffer == 0) {
          return -0x2708;
        }
      }
    }
    else {
      uStack_d0 = 0x11c665;
      swidth = (*alsa_snd_pcm_mmap_begin)
                         ((snd_pcm_t *)bp_local->inputConverter,&area,
                          &bp_local->initialFramesInTempInputBuffer,(snd_pcm_uframes_t *)xrun_local)
      ;
      if (swidth < 0) {
        uStack_d0 = 0x11c680;
        __thread1 = pthread_self();
        uStack_d0 = 0x11c692;
        iVar4 = pthread_equal(__thread1,paUnixMainThread);
        if (iVar4 != 0) {
          local_b0 = (long)swidth;
          uStack_d0 = 0x11c6ae;
          errorText = (*alsa_snd_strerror)(swidth);
          uStack_d0 = 0x11c6c2;
          PaUtil_SetLastHostErrorInfo(paALSA,local_b0,errorText);
        }
        uStack_d0 = 0x11c6d0;
        PaUtil_DebugPrint(
                         "Expression \'alsa_snd_pcm_mmap_begin( self->pcm, &areas, &self->offset, numFrames )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4086\n"
                         );
        return -9999;
      }
      bp_local->tempInputBuffer = area;
    }
    if (bp_local->useNonAdaptingProcess == 0) {
      if (bp_local->userOutputSampleFormatIsEqualToHost == 0) {
        local_78 = bp_local->inputChannelCount / *(uint *)((long)&bp_local->framesPerHostBuffer + 4)
        ;
        p = (uchar *)bp_local->framesPerTempBuffer;
        for (framesAvail._4_4_ = 0; framesAvail._4_4_ < (int)bp_local->framesPerHostBuffer;
            framesAvail._4_4_ = framesAvail._4_4_ + 1) {
          uStack_d0 = 0x11c8d7;
          (*(code *)buffer)(numFrames_local,framesAvail._4_4_,p,1);
          p = p + local_78;
        }
      }
      else {
        for (framesAvail._4_4_ = 0; framesAvail._4_4_ < (int)bp_local->framesPerHostBuffer;
            framesAvail._4_4_ = framesAvail._4_4_ + 1) {
          setChannel = (_func_void_PaUtilBufferProcessor_ptr_uint_void_ptr_uint *)
                       (area + framesAvail._4_4_);
          uStack_d0 = 0x11c868;
          p = ExtractAddress((snd_pcm_channel_area_t *)setChannel,
                             bp_local->initialFramesInTempInputBuffer);
          uStack_d0 = 0x11c882;
          (*(code *)buffer)(numFrames_local,framesAvail._4_4_,p,1);
        }
      }
    }
    else {
      uStack_d0 = 0x11c796;
      sVar8 = (*alsa_snd_pcm_format_size)(bp_local->bytesPerUserOutputSample,1);
      res = (int)sVar8;
      if (bp_local->userOutputSampleFormatIsEqualToHost == 0) {
        local_c0 = (uchar *)bp_local->framesPerTempBuffer;
      }
      else {
        uStack_d0 = 0x11c7b4;
        local_c0 = ExtractAddress(area,bp_local->initialFramesInTempInputBuffer);
      }
      p = local_c0;
      puStack_58 = local_c0;
      for (framesAvail._4_4_ = 0; framesAvail._4_4_ < (int)bp_local->framesPerHostBuffer;
          framesAvail._4_4_ = framesAvail._4_4_ + 1) {
        uStack_d0 = 0x11c806;
        (*(code *)buffer)(numFrames_local,framesAvail._4_4_,puStack_58,
                          *(undefined4 *)((long)&bp_local->framesPerHostBuffer + 4));
        puStack_58 = puStack_58 + res;
      }
    }
    if ((bp_local->userOutputSampleFormatIsEqualToHost == 0) &&
       ((int)bp_local->initialFramesInTempOutputBuffer == 0)) {
      if (bp_local->useNonAdaptingProcess == 0) {
        uVar10 = (ulong)*(uint *)((long)&bp_local->framesPerHostBuffer + 4);
        lVar3 = -(uVar10 * 8 + 0xf & 0xfffffffffffffff0);
        uVar11 = (long)&local_c8 + lVar3;
        uVar5 = bp_local->inputChannelCount / *(uint *)((long)&bp_local->framesPerHostBuffer + 4);
        uStack_a0 = bp_local->framesPerTempBuffer;
        for (local_a4 = 0; local_a4 < *(int *)((long)&bp_local->framesPerHostBuffer + 4);
            local_a4 = local_a4 + 1) {
          *(unsigned_long *)(uVar11 + (long)local_a4 * 8) = uStack_a0;
          uStack_a0 = uStack_a0 + uVar5;
        }
        pPVar1 = bp_local->inputConverter;
        uVar2 = *(undefined8 *)xrun_local;
        local_c8 = uVar11;
        buffer_1._4_4_ = uVar5;
        uStack_90 = uVar10;
        __vla_expr0 = (unsigned_long)&local_c8;
        *(undefined8 *)((long)&uStack_d0 + lVar3) = 0x11ca16;
        local_7c = (*(code *)alsa_snd_pcm_readn)(pPVar1,uVar11,uVar2);
      }
      else {
        uStack_d0 = 0x11c93d;
        sVar9 = (*alsa_snd_pcm_readi)
                          ((snd_pcm_t *)bp_local->inputConverter,
                           (void *)bp_local->framesPerTempBuffer,*(snd_pcm_uframes_t *)xrun_local);
        local_7c = (int)sVar9;
      }
      if ((local_7c == -0x20) || (local_7c == -0x56)) {
        *piStack_28 = 1;
        xrun_local[0] = 0;
        xrun_local[1] = 0;
      }
    }
  }
  else {
    xrun_local[0] = 0;
    xrun_local[1] = 0;
  }
  return areas._4_4_;
}

Assistant:

static PaError PaAlsaStreamComponent_RegisterChannels( PaAlsaStreamComponent* self, PaUtilBufferProcessor* bp,
        unsigned long* numFrames, int* xrun )
{
    PaError result = paNoError;
    const snd_pcm_channel_area_t *areas, *area;
    void (*setChannel)(PaUtilBufferProcessor *, unsigned int, void *, unsigned int) =
        StreamDirection_In == self->streamDir ? PaUtil_SetInputChannel : PaUtil_SetOutputChannel;
    unsigned char *buffer, *p;
    int i;
    unsigned long framesAvail;

    /* This _must_ be called before mmap_begin */
    PA_ENSURE( PaAlsaStreamComponent_GetAvailableFrames( self, &framesAvail, xrun ) );
    if( *xrun )
    {
        *numFrames = 0;
        goto end;
    }

    if( self->canMmap )
    {
        ENSURE_( alsa_snd_pcm_mmap_begin( self->pcm, &areas, &self->offset, numFrames ), paUnanticipatedHostError );
        /* @concern ChannelAdaption Buffer address is recorded so we can do some channel adaption later */
        self->channelAreas = (snd_pcm_channel_area_t *)areas;
    }
    else
    {
        unsigned int bufferSize = self->numHostChannels * alsa_snd_pcm_format_size( self->nativeFormat, *numFrames );
        if( bufferSize > self->nonMmapBufferSize )
        {
            self->nonMmapBuffer = realloc( self->nonMmapBuffer, ( self->nonMmapBufferSize = bufferSize ) );
            if( !self->nonMmapBuffer )
            {
                result = paInsufficientMemory;
                goto error;
            }
        }
    }

    if( self->hostInterleaved )
    {
        int swidth = alsa_snd_pcm_format_size( self->nativeFormat, 1 );

        p = buffer = self->canMmap ? ExtractAddress( areas, self->offset ) : self->nonMmapBuffer;
        for( i = 0; i < self->numUserChannels; ++i )
        {
            /* We're setting the channels up to userChannels, but the stride will be hostChannels samples */
            setChannel( bp, i, p, self->numHostChannels );
            p += swidth;
        }
    }
    else
    {
        if( self->canMmap )
        {
            for( i = 0; i < self->numUserChannels; ++i )
            {
                area = areas + i;
                buffer = ExtractAddress( area, self->offset );
                setChannel( bp, i, buffer, 1 );
            }
        }
        else
        {
            unsigned int buf_per_ch_size = self->nonMmapBufferSize / self->numHostChannels;
            buffer = self->nonMmapBuffer;
            for( i = 0; i < self->numUserChannels; ++i )
            {
                setChannel( bp, i, buffer, 1 );
                buffer += buf_per_ch_size;
            }
        }
    }

    if( !self->canMmap && StreamDirection_In == self->streamDir )
    {
        /* Read sound */
        int res;
        if( self->hostInterleaved )
            res = alsa_snd_pcm_readi( self->pcm, self->nonMmapBuffer, *numFrames );
        else
        {
            void *bufs[self->numHostChannels];
            unsigned int buf_per_ch_size = self->nonMmapBufferSize / self->numHostChannels;
            unsigned char *buffer = self->nonMmapBuffer;
            int i;
            for( i = 0; i < self->numHostChannels; ++i )
            {
                bufs[i] = buffer;
                buffer += buf_per_ch_size;
            }
            res = alsa_snd_pcm_readn( self->pcm, bufs, *numFrames );
        }
        if( res == -EPIPE || res == -ESTRPIPE )
        {
            *xrun = 1;
            *numFrames = 0;
        }
    }

end:
error:
    return result;
}